

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_stereo_balance_pcm_frames_f32
               (float *pFramesOut,float *pFramesIn,ma_uint64 frameCount,float pan)

{
  float factor_1;
  float factor;
  ma_uint64 iFrame;
  float pan_local;
  ma_uint64 frameCount_local;
  float *pFramesIn_local;
  float *pFramesOut_local;
  
  if (pan <= 0.0) {
    if (pFramesOut == pFramesIn) {
      for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
        pFramesOut[iFrame * 2 + 1] = pFramesIn[iFrame * 2 + 1] * (pan + 1.0);
      }
    }
    else {
      for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
        pFramesOut[iFrame * 2] = pFramesIn[iFrame * 2];
        pFramesOut[iFrame * 2 + 1] = pFramesIn[iFrame * 2 + 1] * (pan + 1.0);
      }
    }
  }
  else if (pFramesOut == pFramesIn) {
    for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
      pFramesOut[iFrame * 2] = pFramesIn[iFrame * 2] * (1.0 - pan);
    }
  }
  else {
    for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
      pFramesOut[iFrame * 2] = pFramesIn[iFrame * 2] * (1.0 - pan);
      pFramesOut[iFrame * 2 + 1] = pFramesIn[iFrame * 2 + 1];
    }
  }
  return;
}

Assistant:

static void ma_stereo_balance_pcm_frames_f32(float* pFramesOut, const float* pFramesIn, ma_uint64 frameCount, float pan)
{
    ma_uint64 iFrame;

    if (pan > 0) {
        float factor = 1.0f - pan;
        if (pFramesOut == pFramesIn) {
            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                pFramesOut[iFrame*2 + 0] = pFramesIn[iFrame*2 + 0] * factor;
            }
        } else {
            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                pFramesOut[iFrame*2 + 0] = pFramesIn[iFrame*2 + 0] * factor;
                pFramesOut[iFrame*2 + 1] = pFramesIn[iFrame*2 + 1];
            }
        }
    } else {
        float factor = 1.0f + pan;
        if (pFramesOut == pFramesIn) {
            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                pFramesOut[iFrame*2 + 1] = pFramesIn[iFrame*2 + 1] * factor;
            }
        } else {
            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                pFramesOut[iFrame*2 + 0] = pFramesIn[iFrame*2 + 0];
                pFramesOut[iFrame*2 + 1] = pFramesIn[iFrame*2 + 1] * factor;
            }
        }
    }
}